

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::RgbaOutputFile::writePixels(RgbaOutputFile *this,int numScanLines)

{
  long in_RDI;
  Lock lock;
  int in_stack_000001ac;
  ToYca *in_stack_000001b0;
  int in_stack_0000027c;
  OutputFile *in_stack_00000280;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  Mutex *in_stack_ffffffffffffffd8;
  Lock *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    OutputFile::writePixels(in_stack_00000280,in_stack_0000027c);
  }
  else {
    IlmThread_2_5::Lock::Lock
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
    ToYca::writePixels(in_stack_000001b0,in_stack_000001ac);
    IlmThread_2_5::Lock::~Lock
              ((Lock *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void	
RgbaOutputFile::writePixels (int numScanLines)
{
    if (_toYca)
    {
	Lock lock (*_toYca);
	_toYca->writePixels (numScanLines);
    }
    else
    {
	_outputFile->writePixels (numScanLines);
    }
}